

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecUtil.c
# Opt level: O2

Vec_Int_t * Gia_PolynCollectLastXor(Gia_Man_t *pGia,int fVerbose)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  Vec_Int_t *vXors;
  Gia_Obj_t *pObj;
  long lVar4;
  
  vXors = Vec_IntAlloc(100);
  pObj = Gia_ManCo(pGia,pGia->vCos->nSize + -1);
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pGia);
  Gia_ManIncrementTravId(pGia);
  iVar3 = Gia_ObjFaninId0p(pGia,pObj);
  Gia_PolynCollectXors_rec(pGia,iVar3,vXors);
  iVar3 = -1;
  for (lVar4 = 0; lVar4 < vXors->nSize / 2; lVar4 = lVar4 + 1) {
    piVar2 = vXors->pArray;
    iVar1 = piVar2[lVar4];
    piVar2[lVar4] = piVar2[vXors->nSize + iVar3];
    piVar2[vXors->nSize + iVar3] = iVar1;
    iVar3 = iVar3 + -1;
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  return vXors;
}

Assistant:

Vec_Int_t * Gia_PolynCollectLastXor( Gia_Man_t * pGia, int fVerbose )
{
    Vec_Int_t * vXors = Vec_IntAlloc( 100 );
    Gia_Obj_t * pObj = Gia_ManCo( pGia, Gia_ManCoNum(pGia)-1 );
    ABC_FREE( pGia->pRefs );
    Gia_ManCreateRefs( pGia );
    Gia_ManIncrementTravId( pGia );
    Gia_PolynCollectXors_rec( pGia, Gia_ObjFaninId0p(pGia, pObj), vXors );
    Vec_IntReverseOrder( vXors );
    ABC_FREE( pGia->pRefs );
    return vXors;
}